

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1.c
# Opt level: O2

void t1_dec_clnpass(opj_t1_t *t1,int bpno,int orient,int cblksty)

{
  byte *pbVar1;
  char cVar2;
  int iVar3;
  opj_mqc_t *mqc;
  opj_mqc_t *poVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  ushort uVar15;
  int *piVar16;
  ushort *puVar17;
  ushort uVar18;
  int iVar19;
  uint oneplushalf;
  uint *datap;
  flag_t *pfVar20;
  long lVar21;
  long lVar22;
  uint uVar23;
  flag_t *local_90;
  int *local_88;
  uint local_68;
  uint local_50;
  
  mqc = t1->mqc;
  oneplushalf = (1 << ((byte)bpno & 0x1f)) >> 1 | 1 << (bpno & 0x1fU);
  if ((cblksty & 8U) == 0) {
    local_88 = t1->data;
    local_90 = t1->flags + 1;
    uVar11 = 0;
    while (uVar6 = t1->h, (int)uVar11 < (int)(uVar6 & 0xfffffffc)) {
      local_68 = uVar11 | 2;
      uVar6 = uVar11 + 4;
      lVar22 = 0;
      while( true ) {
        lVar21 = lVar22;
        iVar7 = t1->flags_stride;
        if (t1->w <= lVar21) break;
        piVar16 = local_88 + lVar21;
        pfVar20 = t1->flags;
        lVar22 = lVar21 + 1;
        iVar9 = (int)lVar22;
        if ((((pfVar20[(int)(iVar7 * (uVar11 | 1) + iVar9)] & 0x50ffU) == 0) &&
            ((pfVar20[(int)(iVar7 * local_68 + iVar9)] & 0x50ffU) == 0)) &&
           (((pfVar20[(int)(iVar7 * (uVar11 | 3) + iVar9)] & 0x50ffU) == 0 &&
            ((pfVar20[(int)(iVar7 * uVar6 + iVar9)] & 0x50ffU) == 0)))) {
          mqc->curctx = mqc->ctxs + 0x11;
          iVar7 = mqc_decode(mqc);
          if (iVar7 != 0) {
            mqc->curctx = mqc->ctxs + 0x12;
            iVar7 = mqc_decode(mqc);
            uVar8 = mqc_decode(mqc);
            uVar8 = uVar8 | iVar7 * 2;
            puVar17 = (ushort *)(local_90 + lVar21 + (long)t1->flags_stride * (long)(int)uVar8);
            datap = (uint *)(piVar16 + (long)t1->w * (long)(int)uVar8);
            for (iVar7 = 0; (iVar9 = uVar8 + uVar11 + iVar7, iVar9 < (int)uVar6 && (iVar9 < t1->h));
                iVar7 = iVar7 + 1) {
              puVar17 = puVar17 + t1->flags_stride;
              if (iVar7 == 0) {
                poVar4 = t1->mqc;
                uVar23 = *puVar17 >> 4 & 0xff;
                poVar4->curctx =
                     poVar4->ctxs +
                     "\t\n\f\r\n\n\r\r\f\r\f\r\r\r\r\r\t\n\f\v\n\t\r\f\f\v\f\v\r\f\r\f\t\n\f\v\n\n\v\v\f\r\t\n\r\r\n\n\t\n\f\r\n\t\v\f\f\v\t\n\r\f\n\t\t\n\f\r\n\t\v\f\f\r\f\r\v\f\v\f\t\n\f\v\n\n\v\v\f\v\f\v\v\v\v\v\t\n\f\v\n\t\r\f\f\r\t\n\v\f\n\t\t\n\f\r\n\n\r\r\f\v\t\n\v\v\n\n\t\n\f\r\n\n\r\r\f\v\t\n\v\v\n\n\t\n\f\v\n\t\r\f\f\r\t\n\v\f\n\t\t\n\f\v\n\n\v\v\f\v\f\v\v\v\v\v\t\n\f\r\n\t\v\f\f\r\f\r\v\f\v\f\t\n\f\r\n\t\v\f\f\v\t\n\r\f\n\t\t\n\f\v\n\n\v\v\f\r\t\n\r\r\n\n\t\n\f\v\n\t\r\f\f\v\f\v\r\f\r\f\t\n\f\r\n\n\r\r\f\r\f\r\r\r\r\r"
                     [uVar23];
                uVar10 = mqc_decode(poVar4);
                cVar2 = ""[uVar23];
                uVar23 = -oneplushalf;
                if (uVar10 == (int)cVar2) {
                  uVar23 = oneplushalf;
                }
                *datap = uVar23;
                t1_updateflags((flag_t *)puVar17,uVar10 ^ (int)cVar2,t1->flags_stride);
                *(byte *)((long)puVar17 + 1) = *(byte *)((long)puVar17 + 1) & 0xbf;
              }
              else {
                t1_dec_clnpass_step(t1,(flag_t *)puVar17,(int *)datap,orient,oneplushalf);
              }
              datap = datap + t1->w;
            }
          }
        }
        else {
          pfVar20 = local_90 + lVar21 + iVar7;
          t1_dec_clnpass_step(t1,pfVar20,piVar16,orient,oneplushalf);
          piVar16 = piVar16 + t1->w;
          pfVar20 = pfVar20 + t1->flags_stride;
          t1_dec_clnpass_step(t1,pfVar20,piVar16,orient,oneplushalf);
          iVar7 = t1->w;
          iVar9 = t1->flags_stride;
          t1_dec_clnpass_step(t1,pfVar20 + iVar9,piVar16 + iVar7,orient,oneplushalf);
          t1_dec_clnpass_step(t1,pfVar20 + iVar9 + t1->flags_stride,piVar16 + iVar7 + t1->w,orient,
                              oneplushalf);
        }
      }
      local_88 = local_88 + (t1->w << 2);
      local_90 = local_90 + (iVar7 << 2);
      uVar11 = uVar6;
    }
    uVar14 = (ulong)(uint)t1->w;
    for (lVar22 = 0; lVar22 < (int)uVar14; lVar22 = lVar22 + 1) {
      piVar16 = local_88 + lVar22;
      pfVar20 = local_90 + lVar22;
      for (uVar8 = uVar11; (int)uVar8 < (int)uVar6; uVar8 = uVar8 + 1) {
        pfVar20 = pfVar20 + t1->flags_stride;
        t1_dec_clnpass_step(t1,pfVar20,piVar16,orient,oneplushalf);
        uVar14 = (ulong)t1->w;
        piVar16 = piVar16 + uVar14;
        uVar6 = t1->h;
      }
    }
  }
  else {
    uVar11 = 0;
    while (uVar6 = uVar11, (int)uVar6 < t1->h) {
      local_50 = uVar6 | 2;
      uVar11 = uVar6 + 4;
      iVar7 = 0;
      while (iVar9 = iVar7, iVar9 < t1->w) {
        bVar5 = true;
        if (t1->h <= (int)(uVar6 | 3)) {
LAB_001f6ee7:
          uVar8 = 0;
          goto LAB_001f6eea;
        }
        pfVar20 = t1->flags;
        iVar13 = t1->flags_stride;
        if ((((pfVar20[(int)(iVar13 * (uVar6 | 1) + iVar9 + 1)] & 0x50ffU) != 0) ||
            (iVar7 = iVar9 + 1, (pfVar20[(int)(iVar13 * local_50 + iVar7)] & 0x50ffU) != 0)) ||
           ((pfVar20[(int)(iVar13 * (uVar6 | 3) + iVar7)] & 0x50ffU) != 0)) goto LAB_001f6ee7;
        uVar8 = 0;
        if ((pfVar20[(int)(iVar13 * uVar11 + iVar7)] & 0x50b9U) != 0) goto LAB_001f6eea;
        mqc->curctx = mqc->ctxs + 0x11;
        iVar13 = mqc_decode(mqc);
        if (iVar13 != 0) {
          mqc->curctx = mqc->ctxs + 0x12;
          iVar7 = mqc_decode(mqc);
          uVar8 = mqc_decode(mqc);
          uVar8 = uVar8 | iVar7 * 2;
          bVar5 = false;
LAB_001f6eea:
          iVar7 = uVar6 + uVar8;
          iVar13 = 0;
          while ((iVar7 < (int)uVar11 && (iVar7 < t1->h))) {
            pfVar20 = t1->flags;
            iVar19 = t1->flags_stride * (iVar7 + 1) + iVar9;
            iVar3 = t1->w;
            puVar17 = (ushort *)(pfVar20 + (long)iVar19 + 1);
            uVar15 = *puVar17;
            uVar18 = uVar15 & 0xfbb9;
            if (iVar7 == t1->h + -1) {
              uVar15 = uVar18;
            }
            poVar4 = t1->mqc;
            piVar16 = t1->data;
            if (uVar8 - 3 == iVar13) {
              uVar15 = uVar18;
            }
            if (iVar13 == 0 && !bVar5) {
LAB_001f6fca:
              uVar23 = uVar15 >> 4 & 0xff;
              poVar4->curctx =
                   poVar4->ctxs +
                   "\t\n\f\r\n\n\r\r\f\r\f\r\r\r\r\r\t\n\f\v\n\t\r\f\f\v\f\v\r\f\r\f\t\n\f\v\n\n\v\v\f\r\t\n\r\r\n\n\t\n\f\r\n\t\v\f\f\v\t\n\r\f\n\t\t\n\f\r\n\t\v\f\f\r\f\r\v\f\v\f\t\n\f\v\n\n\v\v\f\v\f\v\v\v\v\v\t\n\f\v\n\t\r\f\f\r\t\n\v\f\n\t\t\n\f\r\n\n\r\r\f\v\t\n\v\v\n\n\t\n\f\r\n\n\r\r\f\v\t\n\v\v\n\n\t\n\f\v\n\t\r\f\f\r\t\n\v\f\n\t\t\n\f\v\n\n\v\v\f\v\f\v\v\v\v\v\t\n\f\r\n\t\v\f\f\r\f\r\v\f\v\f\t\n\f\r\n\t\v\f\f\v\t\n\r\f\n\t\t\n\f\v\n\n\v\v\f\r\t\n\r\r\n\n\t\n\f\v\n\t\r\f\f\v\f\v\r\f\r\f\t\n\f\r\n\n\r\r\f\r\f\r\r\r\r\r"
                   [uVar23];
              uVar10 = mqc_decode(poVar4);
              cVar2 = ""[uVar23];
              uVar23 = -oneplushalf;
              if (uVar10 == (int)cVar2) {
                uVar23 = oneplushalf;
              }
              piVar16[iVar3 * iVar7 + iVar9] = uVar23;
              t1_updateflags((flag_t *)puVar17,uVar10 ^ (int)cVar2,t1->flags_stride);
            }
            else if ((uVar15 & 0x5000) == 0) {
              poVar4->curctx = poVar4->ctxs + ""[(int)(uVar15 & 0xff | orient << 8)];
              iVar12 = mqc_decode(poVar4);
              if (iVar12 != 0) goto LAB_001f6fca;
            }
            pbVar1 = (byte *)((long)pfVar20 + (long)iVar19 * 2 + 3);
            *pbVar1 = *pbVar1 & 0xbf;
            iVar7 = iVar7 + 1;
            iVar13 = iVar13 + -1;
          }
          iVar7 = iVar9 + 1;
        }
      }
    }
  }
  if ((cblksty & 0x20U) != 0) {
    mqc->curctx = mqc->ctxs + 0x12;
    mqc_decode(mqc);
    mqc_decode(mqc);
    mqc_decode(mqc);
    mqc_decode(mqc);
    return;
  }
  return;
}

Assistant:

static void t1_dec_clnpass(
		opj_t1_t *t1,
		int bpno,
		int orient,
		int cblksty)
{
	int i, j, k, one, half, oneplushalf, agg, runlen, vsc;
	int segsym = cblksty & J2K_CCP_CBLKSTY_SEGSYM;
	
	opj_mqc_t *mqc = t1->mqc;	/* MQC component */
	
	one = 1 << bpno;
	half = one >> 1;
	oneplushalf = one | half;
	if (cblksty & J2K_CCP_CBLKSTY_VSC) {
	for (k = 0; k < t1->h; k += 4) {
		for (i = 0; i < t1->w; ++i) {
			if (k + 3 < t1->h) {
					agg = !(MACRO_t1_flags(1 + k,1 + i) & (T1_SIG | T1_VISIT | T1_SIG_OTH)
						|| MACRO_t1_flags(1 + k + 1,1 + i) & (T1_SIG | T1_VISIT | T1_SIG_OTH)
						|| MACRO_t1_flags(1 + k + 2,1 + i) & (T1_SIG | T1_VISIT | T1_SIG_OTH)
						|| (MACRO_t1_flags(1 + k + 3,1 + i) 
						& (~(T1_SIG_S | T1_SIG_SE | T1_SIG_SW |	T1_SGN_S))) & (T1_SIG | T1_VISIT | T1_SIG_OTH));
				} else {
				agg = 0;
			}
			if (agg) {
				mqc_setcurctx(mqc, T1_CTXNO_AGG);
				if (!mqc_decode(mqc)) {
					continue;
				}
				mqc_setcurctx(mqc, T1_CTXNO_UNI);
				runlen = mqc_decode(mqc);
				runlen = (runlen << 1) | mqc_decode(mqc);
			} else {
				runlen = 0;
			}
			for (j = k + runlen; j < k + 4 && j < t1->h; ++j) {
					vsc = (j == k + 3 || j == t1->h - 1) ? 1 : 0;
					t1_dec_clnpass_step_vsc(
						t1,
						&t1->flags[((j+1) * t1->flags_stride) + i + 1],
						&t1->data[(j * t1->w) + i],
						orient,
						oneplushalf,
						agg && (j == k + runlen),
						vsc);
			}
		}
	}
	} else {
		int *data1 = t1->data;
		flag_t *flags1 = &t1->flags[1];
		for (k = 0; k < (t1->h & ~3); k += 4) {
			for (i = 0; i < t1->w; ++i) {
				int *data2 = data1 + i;
				flag_t *flags2 = flags1 + i;
				agg = !(MACRO_t1_flags(1 + k,1 + i) & (T1_SIG | T1_VISIT | T1_SIG_OTH)
					|| MACRO_t1_flags(1 + k + 1,1 + i) & (T1_SIG | T1_VISIT | T1_SIG_OTH)
					|| MACRO_t1_flags(1 + k + 2,1 + i) & (T1_SIG | T1_VISIT | T1_SIG_OTH)
					|| MACRO_t1_flags(1 + k + 3,1 + i) & (T1_SIG | T1_VISIT | T1_SIG_OTH));
				if (agg) {
					mqc_setcurctx(mqc, T1_CTXNO_AGG);
					if (!mqc_decode(mqc)) {
						continue;
					}
					mqc_setcurctx(mqc, T1_CTXNO_UNI);
					runlen = mqc_decode(mqc);
					runlen = (runlen << 1) | mqc_decode(mqc);
					flags2 += runlen * t1->flags_stride;
					data2 += runlen * t1->w;
					for (j = k + runlen; j < k + 4 && j < t1->h; ++j) {
						flags2 += t1->flags_stride;
						if (agg && (j == k + runlen)) {
							t1_dec_clnpass_step_partial(t1, flags2, data2, orient, oneplushalf);
						} else {
							t1_dec_clnpass_step(t1, flags2, data2, orient, oneplushalf);
						}
						data2 += t1->w;
					}
				} else {
					flags2 += t1->flags_stride;
					t1_dec_clnpass_step(t1, flags2, data2, orient, oneplushalf);
					data2 += t1->w;
					flags2 += t1->flags_stride;
					t1_dec_clnpass_step(t1, flags2, data2, orient, oneplushalf);
					data2 += t1->w;
					flags2 += t1->flags_stride;
					t1_dec_clnpass_step(t1, flags2, data2, orient, oneplushalf);
					data2 += t1->w;
					flags2 += t1->flags_stride;
					t1_dec_clnpass_step(t1, flags2, data2, orient, oneplushalf);
					data2 += t1->w;
				}
			}
			data1 += t1->w << 2;
			flags1 += t1->flags_stride << 2;
		}
		for (i = 0; i < t1->w; ++i) {
			int *data2 = data1 + i;
			flag_t *flags2 = flags1 + i;
			for (j = k; j < t1->h; ++j) {
				flags2 += t1->flags_stride;
				t1_dec_clnpass_step(t1, flags2, data2, orient, oneplushalf);
				data2 += t1->w;
			}
		}
	}

	if (segsym) {
		int v = 0;
		mqc_setcurctx(mqc, T1_CTXNO_UNI);
		v = mqc_decode(mqc);
		v = (v << 1) | mqc_decode(mqc);
		v = (v << 1) | mqc_decode(mqc);
		v = (v << 1) | mqc_decode(mqc);
		/*
		if (v!=0xa) {
			opj_event_msg(t1->cinfo, EVT_WARNING, "Bad segmentation symbol %x\n", v);
		} 
		*/
	}
}